

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayoutitem.cpp
# Opt level: O0

void __thiscall
QGraphicsLayoutItemPrivate::setSizeComponent
          (QGraphicsLayoutItemPrivate *this,SizeHint which,SizeComponent component,qreal value)

{
  QGraphicsLayoutItem *pQVar1;
  int in_EDX;
  uint in_ESI;
  QGraphicsLayoutItemPrivate *in_RDI;
  double in_XMM0_Qa;
  qreal *userValue;
  QGraphicsLayoutItem *q;
  double *local_38;
  
  pQVar1 = q_func(in_RDI);
  ensureUserSizeHints((QGraphicsLayoutItemPrivate *)CONCAT44(in_ESI,in_EDX));
  if (in_EDX == 0) {
    local_38 = QSizeF::rwidth(in_RDI->userSizeHints + in_ESI);
  }
  else {
    local_38 = QSizeF::rheight(in_RDI->userSizeHints + in_ESI);
  }
  if ((in_XMM0_Qa != *local_38) || (NAN(in_XMM0_Qa) || NAN(*local_38))) {
    *local_38 = in_XMM0_Qa;
    (*pQVar1->_vptr_QGraphicsLayoutItem[4])();
  }
  return;
}

Assistant:

void QGraphicsLayoutItemPrivate::setSizeComponent(
    Qt::SizeHint which, SizeComponent component, qreal value)
{
    Q_Q(QGraphicsLayoutItem);
    ensureUserSizeHints();
    qreal &userValue = (component == Width)
        ? userSizeHints[which].rwidth()
        : userSizeHints[which].rheight();
    if (value == userValue)
        return;
    userValue = value;
    q->updateGeometry();
}